

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

int __thiscall Polynomial::evaluate(Polynomial *this,int *pt)

{
  pointer piVar1;
  pointer poVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  if (0 < this->mNumStates) {
    piVar1 = (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      piVar1[lVar7] = (int)lVar7;
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->mNumStates);
  }
  if (0 < this->mNumVariables) {
    piVar1 = (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      piVar1[this->mNumStates + lVar7] = pt[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->mNumVariables);
  }
  iVar5 = this->mResultLocation;
  if (this->mFirstOperation <= iVar5) {
    piVar1 = (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    poVar2 = (this->mOperands).
             super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)this->mFirstOperation;
    do {
      lVar6 = lVar7 - this->mFirstOperation;
      switch(poVar2[lVar6].op) {
      case PLUS:
        piVar3 = poVar2[lVar6].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = piVar1[piVar3[1]] + piVar1[*piVar3];
        goto LAB_001076a7;
      case TIMES:
        piVar3 = poVar2[lVar6].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = piVar1[piVar3[1]] * piVar1[*piVar3];
LAB_001076a7:
        iVar5 = iVar5 % this->mNumStates;
        break;
      case POWER:
        piVar3 = poVar2[lVar6].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar8 = piVar3[1];
        if (iVar8 < 1) {
          iVar5 = 1;
        }
        else {
          iVar8 = iVar8 + 1;
          lVar6 = 1;
          do {
            lVar6 = ((long)(int)lVar6 * (long)piVar1[*piVar3]) % (long)this->mNumStates;
            iVar5 = (int)lVar6;
            iVar8 = iVar8 + -1;
          } while (1 < iVar8);
        }
        break;
      case NOT:
        iVar5 = ~piVar1[*poVar2[lVar6].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start] + this->mNumStates;
        break;
      case MAX:
        piVar3 = poVar2[lVar6].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = piVar1[piVar3[1]];
        if (piVar1[piVar3[1]] < piVar1[*piVar3]) {
          iVar5 = piVar1[*piVar3];
        }
        break;
      case MIN:
        piVar3 = poVar2[lVar6].args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = piVar1[*piVar3];
        if (piVar1[piVar3[1]] < piVar1[*piVar3]) {
          iVar5 = piVar1[piVar3[1]];
        }
        break;
      default:
        goto switchD_0010761f_default;
      }
      piVar1[lVar7] = iVar5;
switchD_0010761f_default:
      iVar5 = this->mResultLocation;
      bVar4 = lVar7 < iVar5;
      lVar7 = lVar7 + 1;
    } while (bVar4);
  }
  return (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[iVar5];
}

Assistant:

int Polynomial::evaluate(const int pt[]) {
  // ASSUME: pt is a pointer to an array 0..numvars-1 of values in the range 0..numConstants-1
  // evaluate at a point
  // 1. fill in the n variables values in the array 'mEvaluationValues'.
  for (int i=0; i < mNumStates; ++i)
    mEvaluationValues[i] = i;
  for (int i=0; i<mNumVariables; i++)
    mEvaluationValues[i + mNumStates] = pt[i];
  for (int i = mFirstOperation; i <= mResultLocation; i++)
    {
      operand& a = mOperands[i-mFirstOperation];
      switch (a.op) {
      case operandType::PLUS:
        mEvaluationValues[i] = (mEvaluationValues[a.args[0]]
                                + mEvaluationValues[a.args[1]]) % mNumStates;
        break;
      case operandType::TIMES:
        mEvaluationValues[i] = (mEvaluationValues[a.args[0]]
                                * mEvaluationValues[a.args[1]]) % mNumStates;
        break;
      case operandType::POWER:
        mEvaluationValues[i] = exp(mEvaluationValues[a.args[0]], a.args[1]);
        break;
      case operandType::MAX:
        mEvaluationValues[i] = std::max(mEvaluationValues[a.args[0]],
                                        mEvaluationValues[a.args[1]]);
        break;
      case operandType::MIN:
        mEvaluationValues[i] = std::min(mEvaluationValues[a.args[0]],
                                        mEvaluationValues[a.args[1]]);
        break;
      case operandType::NOT:
        mEvaluationValues[i] = mNumStates - 1 - mEvaluationValues[a.args[0]];
        break;
      }
    }
  return mEvaluationValues[mResultLocation];
}